

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableElement.cpp
# Opt level: O3

void __thiscall
KDReports::TableElementPrivate::createCell
          (TableElementPrivate *this,QTextTable *textTable,ReportBuilder *builder,int row,int column
          ,Cell *cell,QTextCharFormat *charFormat)

{
  int iVar1;
  AlignmentFlag AVar2;
  Alignment alignment;
  VerticalAlignment VVar3;
  undefined8 extraout_RAX;
  int iVar4;
  QTextTableCellFormat tableCellFormat;
  QTextCursor cellCursor;
  ReportBuilder cellBuilder;
  QTextTableCell tableCell;
  QTextFormat aQStack_e8 [16];
  QTextCharFormat local_d8 [8];
  Element local_d0;
  anon_union_24_3_e3d07ef4_for_data local_c0;
  code *local_a8;
  QFont local_60 [28];
  int local_44;
  long local_40 [2];
  
  iVar1 = Cell::columnSpan(cell);
  if (iVar1 < 2) {
    iVar1 = Cell::rowSpan(cell);
    if (iVar1 < 2) goto LAB_00131398;
  }
  iVar1 = Cell::rowSpan(cell);
  Cell::columnSpan(cell);
  QTextTable::mergeCells((int)textTable,row,column,iVar1);
LAB_00131398:
  QTextTable::cellAt((int)local_40,(int)textTable);
  if (local_40[0] != 0) {
    QTextTableCell::firstCursorPosition();
    QTextFormat::toTableCellFormat();
    Element::background((Element *)&local_c0);
    iVar1 = *(int *)(local_c0.shared + 4);
    QBrush::~QBrush((QBrush *)local_c0.data);
    iVar4 = (int)aQStack_e8;
    if (iVar1 != 0) {
      Element::background(&local_d0);
      QBrush::operator_cast_to_QVariant((QVariant *)&local_c0,(QBrush *)&local_d0);
      QTextFormat::setProperty(iVar4,(QVariant *)0x820);
      QVariant::~QVariant((QVariant *)&local_c0);
      QBrush::~QBrush((QBrush *)&local_d0);
    }
    iVar1 = Cell::columnSpan(cell);
    if (iVar1 < 2) {
      QTextFormat::clearProperty(iVar4);
    }
    else {
      QVariant::QVariant((QVariant *)&local_c0,iVar1);
      QTextFormat::setProperty(iVar4,(QVariant *)0x4811);
      QVariant::~QVariant((QVariant *)&local_c0);
    }
    iVar1 = Cell::rowSpan(cell);
    if (iVar1 < 2) {
      QTextFormat::clearProperty(iVar4);
    }
    else {
      QVariant::QVariant((QVariant *)&local_c0,iVar1);
      QTextFormat::setProperty(iVar4,(QVariant *)0x4810);
      QVariant::~QVariant((QVariant *)&local_c0);
    }
    AVar2 = Cell::verticalAlignment(cell);
    if (AVar2 != 0) {
      alignment.i = Cell::verticalAlignment(cell);
      VVar3 = ReportBuilder::toVerticalAlignment(alignment);
      QVariant::QVariant((QVariant *)&local_c0,VVar3);
      QTextFormat::setProperty(iVar4,(QVariant *)0x2021);
      QVariant::~QVariant((QVariant *)&local_c0);
    }
    Cell::cellFormatFunction((CellFormatFunc *)&local_c0,cell);
    if ((code *)local_c0._16_8_ != (code *)0x0) {
      local_d0._vptr_Element._0_4_ = row;
      local_44 = column;
      (*local_a8)((_Any_data *)&local_c0,(int *)&local_d0,&local_44,
                  (QTextTableCellFormat *)aQStack_e8);
      if ((code *)local_c0._16_8_ != (code *)0x0) {
        (*(code *)local_c0._16_8_)(&local_c0,&local_c0,3);
      }
    }
    QTextTableCell::setFormat((QTextCharFormat *)local_40);
    QTextCursor::setCharFormat(local_d8);
    ReportBuilder::ReportBuilder
              ((ReportBuilder *)&local_c0,builder->m_contentDocument,(QTextCursor *)local_d8,
               builder->m_report);
    ReportBuilder::copyStateFrom((ReportBuilder *)&local_c0,builder);
    QTextCharFormat::font();
    QFont::operator=(local_60,(QFont *)&local_d0);
    QFont::~QFont((QFont *)&local_d0);
    Cell::build(cell,(ReportBuilder *)&local_c0);
    ReportBuilder::~ReportBuilder((ReportBuilder *)&local_c0);
    QTextFormat::~QTextFormat(aQStack_e8);
    QTextCursor::~QTextCursor((QTextCursor *)local_d8);
    return;
  }
  createCell();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void KDReports::TableElementPrivate::createCell(QTextTable *textTable, ReportBuilder &builder, int row, int column, const Cell &cell, const QTextCharFormat &charFormat) const
{
    if (cell.columnSpan() > 1 || cell.rowSpan() > 1)
        textTable->mergeCells(row, column, cell.rowSpan(), cell.columnSpan());
    QTextTableCell tableCell = textTable->cellAt(row, column);
    Q_ASSERT(tableCell.isValid());
    QTextCursor cellCursor = tableCell.firstCursorPosition();
    QTextTableCellFormat tableCellFormat(charFormat.toTableCellFormat());
    if (cell.background().style() != Qt::NoBrush)
        tableCellFormat.setBackground(cell.background());
    tableCellFormat.setTableCellColumnSpan(cell.columnSpan());
    tableCellFormat.setTableCellRowSpan(cell.rowSpan());
    if (cell.verticalAlignment() != 0)
        tableCellFormat.setVerticalAlignment(ReportBuilder::toVerticalAlignment(cell.verticalAlignment()));
    if (auto func = cell.cellFormatFunction())
        func(row, column, tableCellFormat);
    tableCell.setFormat(tableCellFormat);
    cellCursor.setCharFormat(tableCellFormat);
    ReportBuilder cellBuilder(builder.currentDocumentData(), cellCursor, builder.report());
    cellBuilder.copyStateFrom(builder);
    cellBuilder.setDefaultFont(charFormat.font());
    cell.build(cellBuilder);
}